

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_LIGHT_AREA(effect_handler_context_t_conflict *context)

{
  loc grid;
  
  if (player->timed[2] == 0) {
    msg("You are surrounded by a white light.");
  }
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  light_room(grid,true);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_LIGHT_AREA(effect_handler_context_t *context)
{
	/* Message */
	if (!player->timed[TMD_BLIND])
		msg("You are surrounded by a white light.");

	/* Light up the room */
	light_room(player->grid, true);

	/* Assume seen */
	context->ident = true;
	return (true);
}